

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t pax_attribute_read_time
                  (archive_read *a,size_t value_length,int64_t *ps,long *pn,size_t *unconsumed)

{
  wchar_t wVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  archive_string local_48;
  
  if (0x80 < value_length) {
    __archive_read_consume(a,value_length);
    *ps = 0;
    *pn = 0;
    return L'\xffffffe2';
  }
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  wVar1 = read_bytes_to_string(a,&local_48,value_length,unconsumed);
  if (wVar1 < L'\0') {
    archive_string_free(&local_48);
    return wVar1;
  }
  plVar2 = ps;
  if (local_48.length != 0) {
    uVar7 = (ulong)(*local_48.s == '-');
    uVar4 = -uVar7;
    if (local_48.length == uVar7) {
      lVar8 = 0;
    }
    else {
      uVar7 = (ulong)(*local_48.s == '-');
      lVar6 = 0;
      lVar8 = 0;
      do {
        bVar5 = local_48.s[lVar6 + uVar7] - 0x30;
        if (9 < bVar5) {
LAB_001332b9:
          *ps = lVar8 * (uVar4 | 1);
          *pn = 0;
          if (local_48.s[lVar6 + uVar7] != '.') goto LAB_0013328b;
          lVar8 = 0;
          uVar3 = 100000000;
          goto LAB_001332f2;
        }
        if ((0xccccccccccccccc < lVar8) || (lVar8 == 0xccccccccccccccc && 7 < bVar5)) {
          lVar8 = 0x7fffffffffffffff;
          goto LAB_001332b9;
        }
        lVar8 = (ulong)bVar5 + lVar8 * 10;
        lVar6 = lVar6 + 1;
      } while (lVar6 != local_48.length + uVar4);
    }
    *ps = lVar8 * (uVar4 | 1);
    plVar2 = pn;
  }
  *plVar2 = 0;
  goto LAB_0013328b;
  while( true ) {
    lVar8 = lVar8 + (byte)(local_48.s[lVar6 + uVar7 + 1] - 0x30U) * uVar3;
    *pn = lVar8;
    lVar6 = lVar6 + 1;
    bVar9 = uVar3 < 10;
    uVar3 = uVar3 / 10;
    if (bVar9) break;
LAB_001332f2:
    if ((local_48.length + uVar4 + -1 == lVar6) ||
       (9 < (byte)(local_48.s[lVar6 + uVar7 + 1] - 0x30U))) break;
  }
LAB_0013328b:
  archive_string_free(&local_48);
  wVar1 = L'\xffffffec';
  if ((ulong)*ps < 0x7fffffffffffffff) {
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
pax_attribute_read_time(struct archive_read *a, size_t value_length, int64_t *ps, long *pn, size_t *unconsumed) {
	struct archive_string as;
	int r;

	if (value_length > 128) {
		__archive_read_consume(a, value_length);
		*ps = 0;
		*pn = 0;
		return (ARCHIVE_FATAL);
	}

	archive_string_init(&as);
	r = read_bytes_to_string(a, &as, value_length, unconsumed);
	if (r < ARCHIVE_OK) {
		archive_string_free(&as);
		return (r);
	}

	pax_time(as.s, archive_strlen(&as), ps, pn);
	archive_string_free(&as);
	if (*ps < 0 || *ps == INT64_MAX) {
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}